

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::SourceCodeInfo_Location::SourceCodeInfo_Location
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *from)

{
  int iVar1;
  void *pvVar2;
  string *psVar3;
  uint uVar4;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SourceCodeInfo_Location_00425890;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  (this->path_).current_size_ = 0;
  *(undefined8 *)&(this->path_).total_size_ = 0;
  *(undefined4 *)((long)&(this->path_).rep_ + 4) = 0;
  iVar1 = (from->path_).current_size_;
  if (iVar1 != 0) {
    RepeatedField<int>::Reserve(&this->path_,iVar1);
    memcpy(((this->path_).rep_)->elements,((from->path_).rep_)->elements,
           (long)(from->path_).current_size_ << 2);
    (this->path_).current_size_ = (from->path_).current_size_;
  }
  (this->span_).current_size_ = 0;
  (this->span_).total_size_ = 0;
  (this->span_).rep_ = (Rep *)0x0;
  iVar1 = (from->span_).current_size_;
  if (iVar1 != 0) {
    RepeatedField<int>::Reserve(&this->span_,iVar1);
    memcpy(((this->span_).rep_)->elements,((from->span_).rep_)->elements,
           (long)(from->span_).current_size_ << 2);
    (this->span_).current_size_ = (from->span_).current_size_;
  }
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,
             &(from->leading_detached_comments_).super_RepeatedPtrFieldBase);
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  (this->leading_comments_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar4 = (from->_has_bits_).has_bits_[0];
  if (((uVar4 & 1) != 0) &&
     (psVar3 = (from->leading_comments_).ptr_,
     psVar3 != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&this->leading_comments_,psVar3);
    uVar4 = (from->_has_bits_).has_bits_[0];
  }
  (this->trailing_comments_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((uVar4 & 2) != 0) &&
     (psVar3 = (from->trailing_comments_).ptr_,
     psVar3 != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&this->trailing_comments_,psVar3);
  }
  return;
}

Assistant:

SourceCodeInfo_Location::SourceCodeInfo_Location(const SourceCodeInfo_Location& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      path_(from.path_),
      span_(from.span_),
      leading_detached_comments_(from.leading_detached_comments_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  leading_comments_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_leading_comments()) {
    leading_comments_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.leading_comments_);
  }
  trailing_comments_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_trailing_comments()) {
    trailing_comments_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.trailing_comments_);
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.SourceCodeInfo.Location)
}